

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O2

string * __thiscall
glcts::(anonymous_namespace)::TriangleDraw::FragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 310 es                                   \nprecision highp float;                            \nflat in mediump vec2 texcoords;                   \nout highp uvec4 FragColor;                        \nuniform mediump sampler2D tex;                    \nvoid main() {                                     \n   vec4 data = textureGather(tex, texcoords, 2);  \n   FragColor = floatBitsToUint(data);             \n}\n"
             ,&local_9);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string FragmentShader()
	{
		return "#version 310 es                                   \n"
			   "precision highp float;                            \n"
			   "flat in mediump vec2 texcoords;                   \n"
			   "out highp uvec4 FragColor;                        \n"
			   "uniform mediump sampler2D tex;                    \n"
			   "void main() {                                     \n"
			   "   vec4 data = textureGather(tex, texcoords, 2);  \n"
			   "   FragColor = floatBitsToUint(data);             \n"
			   "}\n";
	}